

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
DeleteSubrange(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this,int start,int num)

{
  Arena *arena;
  Nonnull<const_char_*> failure_msg;
  void **ppvVar1;
  int line;
  ulong uVar2;
  ulong uVar3;
  LogMessageFatal local_40;
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(start,0,"start >= 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(num,0,"num >= 0");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::log_internal::Check_LEImpl
                              (num + start,(this->super_RepeatedPtrFieldBase).current_size_,
                               "start + num <= size()");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        ppvVar1 = internal::RepeatedPtrFieldBase::elements(&this->super_RepeatedPtrFieldBase);
        arena = (this->super_RepeatedPtrFieldBase).arena_;
        uVar2 = 0;
        uVar3 = 0;
        if (0 < num) {
          uVar3 = (ulong)(uint)num;
        }
        for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
          internal::
          GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Delete((Type *)ppvVar1[(long)start + uVar2],arena);
        }
        UnsafeArenaExtractSubrange
                  (this,start,num,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0);
        return;
      }
      line = 0x589;
    }
    else {
      line = 0x588;
    }
  }
  else {
    line = 0x587;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
}

Assistant:

inline void RepeatedPtrField<Element>::DeleteSubrange(int start, int num) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());
  void** subrange = raw_mutable_data() + start;
  Arena* arena = GetArena();
  for (int i = 0; i < num; ++i) {
    using H = CommonHandler<TypeHandler>;
    H::Delete(static_cast<Element*>(subrange[i]), arena);
  }
  UnsafeArenaExtractSubrange(start, num, nullptr);
}